

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.h
# Opt level: O0

void pzgeom::TPZGeoPyramid::X<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  int64_t iVar2;
  TPZFMatrix<double> *this;
  double *pdVar3;
  TPZVec<double> *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<15,_double> dphi;
  TPZFNMatrix<5,_double> phi;
  double in_stack_fffffffffffffde0;
  double *in_stack_fffffffffffffde8;
  TPZFNMatrix<15,_double> *in_stack_fffffffffffffdf0;
  int local_200;
  int local_1fc;
  TPZFMatrix<double> *in_stack_fffffffffffffeb0;
  TPZFMatrix<double> *in_stack_fffffffffffffeb8;
  TPZVec<double> *in_stack_fffffffffffffec0;
  
  TPZFNMatrix<5,_double>::TPZFNMatrix
            ((TPZFNMatrix<5,_double> *)in_stack_fffffffffffffdf0,(int64_t)in_stack_fffffffffffffde8,
             (int64_t)in_stack_fffffffffffffde0);
  TPZFNMatrix<15,_double>::TPZFNMatrix
            (in_stack_fffffffffffffdf0,(int64_t)in_stack_fffffffffffffde8,
             (int64_t)in_stack_fffffffffffffde0);
  pztopology::TPZPyramid::TShape<double>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  for (local_1fc = 0; local_1fc < (int)iVar2; local_1fc = local_1fc + 1) {
    this = (TPZFMatrix<double> *)TPZVec<double>::operator[](in_RDX,(long)local_1fc);
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    for (local_200 = 0; local_200 < 5; local_200 = local_200 + 1) {
      in_stack_fffffffffffffde8 =
           TPZFMatrix<double>::operator()
                     (this,(int64_t)in_stack_fffffffffffffde8,(int64_t)in_stack_fffffffffffffde0);
      dVar1 = *in_stack_fffffffffffffde8;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1fc,(long)local_200);
      in_stack_fffffffffffffde0 = extraout_XMM0_Qa;
      pdVar3 = TPZVec<double>::operator[](in_RDX,(long)local_1fc);
      *pdVar3 = dVar1 * in_stack_fffffffffffffde0 + *pdVar3;
    }
  }
  TPZFNMatrix<15,_double>::~TPZFNMatrix((TPZFNMatrix<15,_double> *)0x1618b4e);
  TPZFNMatrix<5,_double>::~TPZFNMatrix((TPZFNMatrix<5,_double> *)0x1618b5b);
  return;
}

Assistant:

inline void TPZGeoPyramid::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<5,T> phi(5,1);
        TPZFNMatrix<15,T> dphi(3,5);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 5; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }